

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

void __thiscall tiger::trains::world::Market::Market(Market *this,PostModel *model,World *world)

{
  int iVar1;
  PostModel *in_RSI;
  undefined8 *in_RDI;
  World *unaff_retaddr;
  PostModel *in_stack_00000008;
  BasePost *in_stack_00000010;
  
  BasePost::BasePost(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *in_RDI = &PTR__Market_002d37c8;
  iVar1 = models::PostModel::getProduct(in_RSI);
  *(int *)(in_RDI + 10) = iVar1;
  iVar1 = models::PostModel::getReplenishment(in_RSI);
  *(int *)((long)in_RDI + 0x54) = iVar1;
  iVar1 = models::PostModel::getProductCapacity(in_RSI);
  *(int *)(in_RDI + 0xb) = iVar1;
  return;
}

Assistant:

Market::Market(const models::PostModel &model, World *world)
    : BasePost(model, world)
{
    product = model.getProduct();
    replenishment = model.getReplenishment();
    productCapacity = model.getProductCapacity();
}